

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * CLI::detail::binary_escape_string(string *__return_storage_ptr__,string *string_to_escape)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  size_t __n;
  int iVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  char cVar8;
  size_type sVar9;
  string code;
  stringstream stream;
  long *local_248 [2];
  long local_238 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  string *local_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_228 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_228;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar2 = string_to_escape->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (string_to_escape->_M_dataplus)._M_p;
    sVar9 = 0;
    local_1c0 = string_to_escape;
    do {
      bVar1 = pcVar3[sVar9];
      iVar4 = isprint((uint)bVar1);
      cVar8 = (char)__return_storage_ptr__;
      if (iVar4 == 0) {
        ::std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xffffffb5 | 8;
        ::std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        ::std::__cxx11::stringbuf::str();
        local_1e0[0] = local_1d0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"\\x","");
        plVar5 = (long *)::std::__cxx11::string::append((char *)local_1e0);
        local_220 = &local_210;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_210 = *plVar7;
          lStack_208 = plVar5[3];
        }
        else {
          local_210 = *plVar7;
          local_220 = (long *)*plVar5;
        }
        local_218 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)::std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_248[0]);
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_1f0 = *plVar7;
          lStack_1e8 = plVar5[3];
          local_200 = &local_1f0;
        }
        else {
          local_1f0 = *plVar7;
          local_200 = (long *)*plVar5;
        }
        local_1f8 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_200);
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_1e0[0] != local_1d0) {
          operator_delete(local_1e0[0],local_1d0[0] + 1);
        }
        if (local_248[0] != local_238) {
          operator_delete(local_248[0],local_238[0] + 1);
        }
        ::std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
        ::std::ios_base::~ios_base(local_138);
      }
      else if ((((bVar1 | 0x20) == 0x78) && (__return_storage_ptr__->_M_string_length != 0)) &&
              ((__return_storage_ptr__->_M_dataplus)._M_p
               [__return_storage_ptr__->_M_string_length - 1] == '\\')) {
        local_248[0] = local_238;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"\\x","");
        plVar5 = (long *)::std::__cxx11::string::append((char *)local_248);
        local_1b8 = &local_1a8;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_1a8 = *plVar7;
          lStack_1a0 = plVar5[3];
        }
        else {
          local_1a8 = *plVar7;
          local_1b8 = (long *)*plVar5;
        }
        local_1b0 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1b8);
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8,local_1a8 + 1);
        }
        if (local_248[0] != local_238) {
          operator_delete(local_248[0],local_238[0] + 1);
        }
      }
      else {
        ::std::__cxx11::string::push_back(cVar8);
      }
      sVar9 = sVar9 + 1;
    } while (sVar2 != sVar9);
    __n = local_1c0->_M_string_length;
    if ((__return_storage_ptr__->_M_string_length != __n) ||
       ((__n != 0 &&
        (iVar4 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(local_1c0->_M_dataplus)._M_p,__n),
        iVar4 != 0)))) {
      lVar6 = ::std::__cxx11::string::find(cVar8,0x27);
      while (lVar6 != -1) {
        (__return_storage_ptr__->_M_dataplus)._M_p[lVar6] = '\\';
        ::std::__cxx11::string::replace
                  ((ulong)__return_storage_ptr__,lVar6 + 1,(char *)0x0,0x16fa91);
        lVar6 = ::std::__cxx11::string::find(cVar8,0x27);
      }
      ::std::__cxx11::string::replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x16f8c4);
      ::std::__cxx11::string::push_back(cVar8);
      ::std::__cxx11::string::push_back(cVar8);
      ::std::__cxx11::string::push_back(cVar8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string binary_escape_string(const std::string &string_to_escape) {
    // s is our escaped output string
    std::string escaped_string{};
    // loop through all characters
    for(char c : string_to_escape) {
        // check if a given character is printable
        // the cast is necessary to avoid undefined behaviour
        if(isprint(static_cast<unsigned char>(c)) == 0) {
            std::stringstream stream;
            // if the character is not printable
            // we'll convert it to a hex string using a stringstream
            // note that since char is signed we have to cast it to unsigned first
            stream << std::hex << static_cast<unsigned int>(static_cast<unsigned char>(c));
            std::string code = stream.str();
            escaped_string += std::string("\\x") + (code.size() < 2 ? "0" : "") + code;
        } else if(c == 'x' || c == 'X') {
            // need to check for inadvertent binary sequences
            if(!escaped_string.empty() && escaped_string.back() == '\\') {
                escaped_string += std::string("\\x") + (c == 'x' ? "78" : "58");
            } else {
                escaped_string.push_back(c);
            }

        } else {
            escaped_string.push_back(c);
        }
    }
    if(escaped_string != string_to_escape) {
        auto sqLoc = escaped_string.find('\'');
        while(sqLoc != std::string::npos) {
            escaped_string[sqLoc] = '\\';
            escaped_string.insert(sqLoc + 1, "x27");
            sqLoc = escaped_string.find('\'');
        }
        escaped_string.insert(0, "'B\"(");
        escaped_string.push_back(')');
        escaped_string.push_back('"');
        escaped_string.push_back('\'');
    }
    return escaped_string;
}